

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.cpp
# Opt level: O0

void __thiscall QStyleOptionGroupBox::QStyleOptionGroupBox(QStyleOptionGroupBox *this,int version)

{
  undefined4 in_ESI;
  long in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  QStyleOptionComplex::QStyleOptionComplex
            ((QStyleOptionComplex *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  QFlags<QStyleOptionFrame::FrameFeature>::QFlags
            ((QFlags<QStyleOptionFrame::FrameFeature> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             (FrameFeature)((ulong)in_RDI >> 0x20));
  QString::QString((QString *)0x41cde4);
  QFlags<Qt::AlignmentFlag>::QFlags
            ((QFlags<Qt::AlignmentFlag> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             (AlignmentFlag)((ulong)in_RDI >> 0x20));
  QColor::QColor((QColor *)0x41ce03);
  *(undefined4 *)(in_RDI + 0x7c) = 0;
  *(undefined4 *)(in_RDI + 0x80) = 0;
  return;
}

Assistant:

QStyleOptionGroupBox::QStyleOptionGroupBox(int version)
    : QStyleOptionComplex(version, Type), features(QStyleOptionFrame::None),
      textAlignment(Qt::AlignLeft), lineWidth(0), midLineWidth(0)
{
}